

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O3

int fiobj_hash_haskey(FIOBJ hash,FIOBJ key)

{
  FIOBJ hash_value;
  fiobj_object_vtable_s *pfVar1;
  fio_hash____map_s_ *pfVar2;
  code *in_RCX;
  uint uVar3;
  fio_hash___couplet_s obj;
  fio_str_info_s s;
  fio_str_info_s local_30;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x141,"int fiobj_hash_haskey(const FIOBJ, FIOBJ)");
  }
  uVar3 = (uint)key;
  if ((uVar3 & 7) == 2) {
    hash_value = fiobj_str_hash(key);
    goto LAB_00143420;
  }
  hash_value = key;
  if ((((uVar3 & 6) == 6) || (key == 0)) || (in_RCX = (code *)(ulong)(uVar3 & 1), (key & 1) != 0))
  goto LAB_00143420;
  if ((key & 6) == 0) {
    switch(*(undefined1 *)(key & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar1 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_001433e2_caseD_28;
    case 0x29:
      pfVar1 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_001433e2_caseD_2a;
    case 0x2b:
      pfVar1 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar1 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if ((uVar3 & 6) == 2) {
switchD_001433e2_caseD_28:
    pfVar1 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_001433e2_caseD_2a:
    pfVar1 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar1->to_str)(&local_30,key);
  in_RCX = fiobj_free_complex_object;
  hash_value = fio_siphash13(local_30.data,local_30.len,0x1456f2,0x145bc9);
LAB_00143420:
  obj.obj = (FIOBJ)in_RCX;
  obj.key = key;
  pfVar2 = fio_hash____find_map_pos_
                     ((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,obj);
  uVar3 = 0;
  if ((pfVar2 != (fio_hash____map_s_ *)0x0) && (pfVar2->pos != (fio_hash____ordered_s_ *)0x0)) {
    uVar3 = (uint)((pfVar2->pos->obj).obj != 0);
  }
  return uVar3;
}

Assistant:

int fiobj_hash_haskey(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key) !=
         FIOBJ_INVALID;
}